

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.cpp
# Opt level: O2

idx_t __thiscall
duckdb::roaring::ContainerMetadataCollection::GetMetadataSize
          (ContainerMetadataCollection *this,idx_t container_count,idx_t run_containers,
          idx_t array_containers)

{
  idx_t iVar1;
  idx_t iVar2;
  
  iVar1 = BitpackingPrimitives::GetRequiredSize(container_count,'\x02');
  iVar2 = BitpackingPrimitives::GetRequiredSize(run_containers,'\a');
  return iVar2 + iVar1 + array_containers;
}

Assistant:

idx_t ContainerMetadataCollection::GetMetadataSize(idx_t container_count, idx_t run_containers,
                                                   idx_t array_containers) const {
	idx_t types_size = BitpackingPrimitives::GetRequiredSize(container_count, CONTAINER_TYPE_BITWIDTH);
	idx_t runs_size = BitpackingPrimitives::GetRequiredSize(run_containers, RUN_CONTAINER_SIZE_BITWIDTH);
	idx_t arrays_size = sizeof(uint8_t) * array_containers;
	return types_size + runs_size + arrays_size;
}